

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O0

FFSTypeHandle_conflict FFSread_format(FFSFile ffsfile)

{
  int iVar1;
  FFSBuffer p_Var2;
  FMContext iocontext;
  char *server_id;
  uint *puVar3;
  FMFormat_conflict p_Var4;
  long in_RDI;
  int unaff_retaddr;
  FFSTypeHandle_conflict handle;
  FMFormat_conflict format;
  char *rep;
  char *id;
  FFSFile in_stack_00000088;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  int id_size;
  void *in_stack_ffffffffffffffe0;
  FFSFile in_stack_ffffffffffffffe8;
  FFSFile local_8;
  
  if (*(int *)(in_RDI + 0x48) == 0) {
    next_record_type(in_stack_00000088);
  }
  while( true ) {
    while( true ) {
      id_size = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
      if (*(int *)(in_RDI + 0x54) == 8) {
        iocontext = (FMContext)ffs_malloc((size_t)in_stack_ffffffffffffffd0);
        server_id = (char *)ffs_malloc((size_t)in_stack_ffffffffffffffd0);
        iVar1 = (**(code **)(in_RDI + 0xc0))
                          (*(undefined8 *)(in_RDI + 0x20),iocontext,(long)*(int *)(in_RDI + 0x34),0)
        ;
        if (iVar1 == *(int *)(in_RDI + 0x34)) {
          iVar1 = (**(code **)(in_RDI + 0xc0))
                            (*(undefined8 *)(in_RDI + 0x20),server_id,*(undefined8 *)(in_RDI + 0x38)
                             ,0);
          if ((long)iVar1 == *(long *)(in_RDI + 0x38)) {
            *(undefined4 *)(in_RDI + 0x48) = 0;
            p_Var4 = load_external_format_FMcontext
                               (iocontext,server_id,id_size,in_stack_ffffffffffffffd0);
            free(iocontext);
            local_8 = (FFSFile)FFSTypeHandle_by_index((FFSContext)handle,unaff_retaddr);
            init_format_info(local_8,in_stack_ffffffffffffffcc);
            *(undefined4 *)(*(long *)(in_RDI + 0x28) + (long)p_Var4->format_index * 4) = 1;
          }
          else {
            puVar3 = (uint *)__errno_location();
            printf("Read failed, errno %d\n",(ulong)*puVar3);
            local_8 = (FFSFile)0x0;
          }
        }
        else {
          puVar3 = (uint *)__errno_location();
          printf("Read failed, errno %d\n",(ulong)*puVar3);
          local_8 = (FFSFile)0x0;
        }
        return (FFSTypeHandle_conflict)local_8;
      }
      in_stack_ffffffffffffffcc = *(int *)(in_RDI + 0x54);
      if (in_stack_ffffffffffffffcc != 4) break;
      if (*(long *)(in_RDI + 0x18) == 0) {
        p_Var2 = create_FFSBuffer();
        *(FFSBuffer *)(in_RDI + 0x18) = p_Var2;
      }
      FFSread(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      next_record_type(in_stack_00000088);
    }
    if (in_stack_ffffffffffffffcc != 0x10) break;
    if (*(long *)(in_RDI + 0x18) == 0) {
      p_Var2 = create_FFSBuffer();
      *(FFSBuffer *)(in_RDI + 0x18) = p_Var2;
    }
    FFSread_comment((FFSFile)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    next_record_type(in_stack_00000088);
  }
  return (FFSTypeHandle_conflict)0x0;
}

Assistant:

extern FFSTypeHandle
FFSread_format(FFSFile ffsfile)
{
    char *id;
    char *rep;
    FMFormat format;
    FFSTypeHandle handle;
    if (ffsfile->read_ahead == FALSE) {
	(void) next_record_type(ffsfile);
    }
    while (ffsfile->next_record_type != FFSformat) {
	switch (ffsfile->next_record_type) {
	case FFScomment:
	    if (ffsfile->tmp_buffer == NULL) {
		ffsfile->tmp_buffer = create_FFSBuffer();
	    }
	    (void) FFSread_comment(ffsfile);
	    (void) next_record_type(ffsfile);
	    break;
	case FFSdata:
	    if (ffsfile->tmp_buffer == NULL) {
		ffsfile->tmp_buffer = create_FFSBuffer();
	    }
	    (void) FFSread(ffsfile, NULL);
	    (void) next_record_type(ffsfile);
	    break;
	default:
	    return NULL;
	}
    }
    
    id = malloc(ffsfile->next_fid_len);
    rep = malloc(ffsfile->next_data_len);
    if (ffsfile->read_func(ffsfile->file_id, id, 
			   ffsfile->next_fid_len, NULL, NULL)
	!= ffsfile->next_fid_len) {
	printf("Read failed, errno %d\n", errno);
	return NULL;
    }
    if (ffsfile->read_func(ffsfile->file_id, rep, 
			   ffsfile->next_data_len, NULL, NULL)
	!= ffsfile->next_data_len) {
	printf("Read failed, errno %d\n", errno);
	return NULL;
    }
    ffsfile->read_ahead = FALSE;
    format = load_external_format_FMcontext(ffsfile->c->fmc, id, 
					    ffsfile->next_fid_len, rep);
    free(id);
    handle = FFSTypeHandle_by_index(ffsfile->c, format->format_index);

    /* in case we're in append mode, mark this as ready in the file */
    init_format_info(ffsfile, format->format_index);
    ffsfile->info[format->format_index].written_to_file = 1;
    return handle;
}